

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx11.cc
# Opt level: O1

bool pairwise_equal<int,double,double,std::__cxx11::string,std::__cxx11::string>
               (int *a,int *b,double rest,double rest_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest_2,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest_3)

{
  int iVar1;
  int iVar2;
  pointer pcVar3;
  int iVar4;
  bool bVar5;
  long *local_60;
  size_t local_58;
  long local_50 [2];
  long *local_40;
  size_t local_38;
  long local_30 [2];
  
  iVar1 = *a;
  iVar2 = *b;
  if (iVar1 == iVar2) {
    local_60 = local_50;
    pcVar3 = (rest_2->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar3,pcVar3 + rest_2->_M_string_length);
    local_40 = local_30;
    pcVar3 = (rest_3->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar3,pcVar3 + rest_3->_M_string_length);
    if (((rest == rest_1) && (!NAN(rest) && !NAN(rest_1))) && (local_58 == local_38)) {
      if (local_58 == 0) {
        bVar5 = true;
      }
      else {
        iVar4 = bcmp(local_60,local_40,local_58);
        bVar5 = iVar4 == 0;
      }
      goto LAB_0011f5af;
    }
  }
  bVar5 = false;
LAB_0011f5af:
  if (iVar1 == iVar2) {
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
    if (local_60 != local_50) {
      operator_delete(local_60,local_50[0] + 1);
    }
  }
  return bVar5;
}

Assistant:

bool
pairwise_equal(A const& a, A const& b)
{
    return (a == b);
}